

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveFile.cpp
# Opt level: O2

void __thiscall DirectiveObjImport::DirectiveObjImport(DirectiveObjImport *this,path *inputName)

{
  ElfRelocator *this_00;
  int iVar1;
  
  CAssemblerCommand::CAssemblerCommand(&this->super_CAssemblerCommand);
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__DirectiveObjImport_001b91a8;
  this_00 = &this->rel;
  ElfRelocator::ElfRelocator(this_00);
  (this->ctor)._M_t.
  super___uniq_ptr_impl<CAssemblerCommand,_std::default_delete<CAssemblerCommand>_>._M_t.
  super__Tuple_impl<0UL,_CAssemblerCommand_*,_std::default_delete<CAssemblerCommand>_>.
  super__Head_base<0UL,_CAssemblerCommand_*,_false>._M_head_impl = (CAssemblerCommand *)0x0;
  iVar1 = ElfRelocator::init(this_00,(EVP_PKEY_CTX *)inputName);
  (this->super_CAssemblerCommand).field_0x14 = (char)iVar1;
  if ((char)iVar1 != '\0') {
    ElfRelocator::exportSymbols(this_00);
  }
  return;
}

Assistant:

DirectiveObjImport::DirectiveObjImport(const fs::path& inputName)
{
	ctor = nullptr;
	success = rel.init(inputName);
	if (success)
		rel.exportSymbols();
}